

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzio.c
# Opt level: O2

int cm_zlib_gzflush(gzFile file,int flush)

{
  int iVar1;
  
  iVar1 = do_flush(file,flush);
  if (iVar1 == 0) {
    fflush(*(FILE **)((long)file + 0x78));
    iVar1 = 0;
    if (*(int *)((long)file + 0x70) != 1) {
      iVar1 = *(int *)((long)file + 0x70);
    }
  }
  return iVar1;
}

Assistant:

int ZEXPORT gzflush (file, flush)
     gzFile file;
     int flush;
{
    gz_stream *s = (gz_stream*)file;
    int err = do_flush (file, flush);

    if (err) return err;
    fflush(s->file);
    return  s->z_err == Z_STREAM_END ? Z_OK : s->z_err;
}